

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_analyze.hpp
# Opt level: O3

bool duckdb::PatasAnalyze<double>(AnalyzeState *state,Vector *input,idx_t count)

{
  InternalException *this;
  string local_40;
  
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Patas has been deprecated, can no longer be used to compress data"
             ,"");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool PatasAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	throw InternalException("Patas has been deprecated, can no longer be used to compress data");
	return false;
}